

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaselineComparison.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  double dVar1;
  bool bVar2;
  ErrorCode EVar3;
  result_type_conflict1 rVar4;
  ulong uVar5;
  size_type sVar6;
  char *path;
  ostream *poVar7;
  rep rVar8;
  reference pvVar9;
  reference pdVar10;
  reference piVar11;
  pointer *this;
  reference pbVar12;
  reference pvVar13;
  __type _Var14;
  Parameters local_2d70;
  Parameters local_2cc8;
  Parameters local_2c20;
  Parameters local_2b78;
  Parameters local_2ad0;
  Parameters local_2a28;
  value_type local_2980;
  EdgeIdx triangle_count;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> algo_name;
  iterator __end4;
  iterator __begin4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range4;
  VertexIdx seed;
  VertexIdx sC;
  uniform_int_distribution<long> dist_seed_vertex;
  VertexIdx n;
  iterator iStack_2910;
  int seed_count;
  iterator __end3;
  iterator __begin3;
  vector<int,_std::allocator<int>_> *__range3;
  double sparsification_prob;
  iterator __end2;
  iterator __begin2;
  vector<double,_std::allocator<double>_> *__range2;
  mt19937 mt;
  random_device rd;
  Parameters params;
  duration<long,_std::ratio<1L,_1L>_> local_118;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_110;
  time_point endTime;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_f8;
  time_point startTime;
  undefined1 local_e8 [4];
  int i;
  config_params cfp;
  CGraph cg;
  char **argv_local;
  int argc_local;
  
  if (argc == 2) {
    LoadConfig((config_params *)local_e8,argv[1]);
    for (startTime.__d.__r._4_4_ = 0; uVar5 = (ulong)startTime.__d.__r._4_4_,
        sVar6 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_e8), uVar5 < sVar6;
        startTime.__d.__r._4_4_ = startTime.__d.__r._4_4_ + 1) {
      local_f8.__d.__r = (duration)std::chrono::_V2::system_clock::now();
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_e8,(long)startTime.__d.__r._4_4_);
      path = (char *)std::__cxx11::string::c_str();
      EVar3 = Escape::loadGraphCSR(path,(CGraph *)&cfp.print_to_console,1);
      if (EVar3 != ecNone) {
        exit(1);
      }
      local_110.__d.__r = (duration)std::chrono::_V2::system_clock::now();
      poVar7 = std::operator<<((ostream *)&std::cout,"Time to load graph = ");
      params._160_8_ = std::chrono::operator-(&local_110,&local_f8);
      local_118.__r =
           (rep)std::chrono::
                duration_cast<std::chrono::duration<long,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                          ((duration<long,_std::ratio<1L,_1000000000L>_> *)&params.print_to_console)
      ;
      rVar8 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_118);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,rVar8);
      poVar7 = std::operator<<(poVar7," seconds");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      poVar7 = std::operator<<((ostream *)&std::cout,"#Graph name : ");
      pvVar9 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_e8,(long)startTime.__d.__r._4_4_);
      poVar7 = std::operator<<(poVar7,(string *)pvVar9);
      poVar7 = std::operator<<(poVar7,"#Vertices = ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,cfp._168_8_);
      poVar7 = std::operator<<(poVar7,",#Edges = ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,cg.nVertices);
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      Parameters::Parameters((Parameters *)((long)&rd.field_0 + 0x1380));
      pvVar9 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_e8,(long)startTime.__d.__r._4_4_);
      std::__cxx11::string::operator=((string *)((long)&rd.field_0 + 0x1380),(string *)pvVar9);
      params.subsample_size._0_4_ =
           cfp.triangle_count.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._0_4_;
      params.out_directory.field_2._M_local_buf[8] = cfp.out_directory.field_2._M_local_buf[8] & 1;
      params.out_directory.field_2._M_local_buf[9] = cfp.out_directory.field_2._M_local_buf[9] & 1;
      std::__cxx11::string::operator=
                ((string *)(params.algo_name.field_2._M_local_buf + 8),
                 (string *)
                 &cfp.algo_names.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      params.out_directory.field_2._M_local_buf[10] =
           cfp.out_directory.field_2._M_local_buf[0xb] & 1;
      std::random_device::random_device((random_device *)&mt._M_p);
      rVar4 = std::random_device::operator()((random_device *)&mt._M_p);
      std::
      mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
      ::mersenne_twister_engine
                ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                  *)&__range2,(ulong)rVar4);
      __end2 = std::vector<double,_std::allocator<double>_>::begin
                         ((vector<double,_std::allocator<double>_> *)&cfp.no_of_repeats);
      sparsification_prob =
           (double)std::vector<double,_std::allocator<double>_>::end
                             ((vector<double,_std::allocator<double>_> *)&cfp.no_of_repeats);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                         *)&sparsification_prob), bVar2) {
        pdVar10 = __gnu_cxx::
                  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                  operator*(&__end2);
        dVar1 = *pdVar10;
        __end3 = std::vector<int,_std::allocator<int>_>::begin
                           ((vector<int,_std::allocator<int>_> *)&cfp.subsample_prob);
        iStack_2910 = std::vector<int,_std::allocator<int>_>::end
                                ((vector<int,_std::allocator<int>_> *)&cfp.subsample_prob);
        while (bVar2 = __gnu_cxx::operator!=(&__end3,&stack0xffffffffffffd6f0), bVar2) {
          piVar11 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                    operator*(&__end3);
          params.filename.field_2._8_8_ = SEXT48(*piVar11);
          std::vector<long,_std::allocator<long>_>::clear
                    ((vector<long,_std::allocator<long>_> *)&params.seed_count);
          dist_seed_vertex._M_param._M_b._0_1_ = cfp.print_to_console;
          dist_seed_vertex._M_param._M_b._1_1_ = cfp.print_to_file;
          dist_seed_vertex._M_param._M_b._2_1_ = cfp.degree_bin_seed;
          dist_seed_vertex._M_param._M_b._3_1_ = cfp.edge_count_available;
          dist_seed_vertex._M_param._M_b._4_1_ = cfp.CSS;
          dist_seed_vertex._M_param._M_b._5_1_ = cfp.NB;
          dist_seed_vertex._M_param._M_b._6_2_ = cfp._174_2_;
          std::uniform_int_distribution<long>::uniform_int_distribution
                    ((uniform_int_distribution<long> *)&sC,0,cfp._168_8_ + -1);
          for (seed = 0; seed < (long)params.filename.field_2._8_8_; seed = seed + 1) {
            __range4 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)std::uniform_int_distribution<long>::operator()
                                    ((uniform_int_distribution<long> *)&sC,
                                     (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                                      *)&__range2);
            std::vector<long,std::allocator<long>>::emplace_back<long&>
                      ((vector<long,std::allocator<long>> *)&params.seed_count,(long *)&__range4);
          }
          this = &cfp.seed_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
          __end4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)this);
          algo_name.field_2._8_8_ =
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)this);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end4,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                             *)((long)&algo_name.field_2 + 8)), bVar2) {
            pbVar12 = __gnu_cxx::
                      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator*(&__end4);
            std::__cxx11::string::string((string *)&triangle_count,(string *)pbVar12);
            std::__cxx11::string::operator=
                      ((string *)&params.sparsification_prob,(string *)&triangle_count);
            params.seed_vertices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 (pointer)(long)((double)cg.nVertices * dVar1);
            params.walk_length =
                 (EdgeIdx)((double)(long)params.seed_vertices.
                                         super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                         super__Vector_impl_data._M_end_of_storage *
                          (double)cfp.sparsification_prob.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage);
            params._80_8_ = dVar1;
            pvVar13 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                                ((vector<long_long,_std::allocator<long_long>_> *)
                                 &cfp.input_files.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (long)startTime.__d.__r._4_4_);
            local_2980 = *pvVar13;
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&triangle_count,"TETRIS");
            if (bVar2) {
              Parameters::Parameters(&local_2a28,(Parameters *)((long)&rd.field_0 + 0x1380));
              TriangleEstimator<Estimates(*)(Escape::CGraph*,Parameters)>
                        ((CGraph *)&cfp.print_to_console,&local_2a28,local_2980,TETRIS);
              Parameters::~Parameters(&local_2a28);
            }
            else {
              bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&triangle_count,"VertexMCMC");
              if (bVar2) {
                _Var14 = std::floor<long>(((long)params.seed_vertices.
                                                 super__Vector_base<long,_std::allocator<long>_>.
                                                 _M_impl.super__Vector_impl_data._M_end_of_storage *
                                          0x16) / 0x50);
                params.seed_vertices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)(long)_Var14;
                Parameters::Parameters(&local_2ad0,(Parameters *)((long)&rd.field_0 + 0x1380));
                TriangleEstimator<Estimates(*)(Escape::CGraph*,Parameters)>
                          ((CGraph *)&cfp.print_to_console,&local_2ad0,local_2980,VertexMCMC);
                Parameters::~Parameters(&local_2ad0);
              }
              else {
                bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&triangle_count,"SRW1");
                if (bVar2) {
                  _Var14 = std::floor<long>(((long)params.seed_vertices.
                                                   super__Vector_base<long,_std::allocator<long>_>.
                                                   _M_impl.super__Vector_impl_data._M_end_of_storage
                                            * 0x16) / 0x28);
                  params.seed_vertices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)(long)_Var14;
                  params.out_directory.field_2._M_local_buf[0xb] =
                       cfp.out_directory.field_2._M_local_buf[0xc] & 1;
                  params.out_directory.field_2._M_local_buf[0xc] =
                       cfp.out_directory.field_2._M_local_buf[0xd] & 1;
                  Parameters::Parameters(&local_2b78,(Parameters *)((long)&rd.field_0 + 0x1380));
                  TriangleEstimator<Estimates(*)(Escape::CGraph*,Parameters)>
                            ((CGraph *)&cfp.print_to_console,&local_2b78,local_2980,SRW1);
                  Parameters::~Parameters(&local_2b78);
                }
                else {
                  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)&triangle_count,"SERWC");
                  if (bVar2) {
                    _Var14 = std::floor<long>(((long)params.seed_vertices.
                                                     super__Vector_base<long,_std::allocator<long>_>
                                                     ._M_impl.super__Vector_impl_data.
                                                     _M_end_of_storage * 2) / 3);
                    params.seed_vertices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage = (pointer)(long)_Var14;
                    Parameters::Parameters(&local_2c20,(Parameters *)((long)&rd.field_0 + 0x1380));
                    TriangleEstimator<Estimates(*)(Escape::CGraph*,Parameters)>
                              ((CGraph *)&cfp.print_to_console,&local_2c20,local_2980,SERWC);
                    Parameters::~Parameters(&local_2c20);
                  }
                  else {
                    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&triangle_count,"SEC");
                    if (bVar2) {
                      _Var14 = std::floor<long>(((long)params.seed_vertices.
                                                                                                              
                                                  super__Vector_base<long,_std::allocator<long>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage
                                                * 2) / 3);
                      params.seed_vertices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage = (pointer)(long)_Var14;
                      Parameters::Parameters(&local_2cc8,(Parameters *)((long)&rd.field_0 + 0x1380))
                      ;
                      TriangleEstimator<Estimates(*)(Escape::CGraph*,Parameters)>
                                ((CGraph *)&cfp.print_to_console,&local_2cc8,local_2980,SEC);
                      Parameters::~Parameters(&local_2cc8);
                    }
                    else {
                      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)&triangle_count,"UESS");
                      if (bVar2) {
                        _Var14 = std::floor<long>((long)params.seed_vertices.
                                                                                                                
                                                  super__Vector_base<long,_std::allocator<long>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage)
                        ;
                        params.seed_vertices.super__Vector_base<long,_std::allocator<long>_>._M_impl
                        .super__Vector_impl_data._M_end_of_storage = (pointer)(long)_Var14;
                        Parameters::Parameters
                                  (&local_2d70,(Parameters *)((long)&rd.field_0 + 0x1380));
                        TriangleEstimator<Estimates(*)(Escape::CGraph*,Parameters)>
                                  ((CGraph *)&cfp.print_to_console,&local_2d70,local_2980,UESS);
                        Parameters::~Parameters(&local_2d70);
                      }
                      else {
                        std::operator<<((ostream *)&std::cout,"Unknown algorithm option. \n");
                      }
                    }
                  }
                }
              }
            }
            std::__cxx11::string::~string((string *)&triangle_count);
            __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&__end4);
          }
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&__end3);
        }
        __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
        operator++(&__end2);
      }
      std::random_device::~random_device((random_device *)&mt._M_p);
      Parameters::~Parameters((Parameters *)((long)&rd.field_0 + 0x1380));
    }
    config_params::~config_params((config_params *)local_e8);
  }
  else {
    std::operator<<((ostream *)&std::cout,"Usage File: ./SubgraphCount script_file\n\n");
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {

    CGraph cg;
    if (argc != 2) {
        std::cout << "Usage File: ./SubgraphCount script_file\n\n";
        return 0;
    }
    config_params cfp = LoadConfig(argv[1]);

    for (int i = 0; i < cfp.input_files.size(); i++) {
        /**
         * Load the input graph and print relevant parameters
         */
        auto startTime = std::chrono::high_resolution_clock::now();
        if (loadGraphCSR(cfp.input_files[i].c_str(), cg, 1))
            exit(1);
        auto endTime = std::chrono::high_resolution_clock::now();
        std::cout << "Time to load graph = " <<
                  std::chrono::duration_cast<std::chrono::seconds>(endTime - startTime).count()
                  << " seconds" << std::endl;
        std::cout << "#Graph name : " << cfp.input_files[i] << "#Vertices = " << cg.nVertices << ",#Edges = " << cg.nEdges << std::endl;

        /**
         * Load relevant parameters
         */
        Parameters params;
        params.filename = cfp.input_files[i];
        params.no_of_repeat = cfp.no_of_repeats;
        params.print_to_console = cfp.print_to_console;
        params.print_to_file = cfp.print_to_file;
        params.out_directory = cfp.out_directory;
        params.normalization_count_available = cfp.edge_count_available;

        /**
         * Set up randomness initiator
         */
        std::random_device rd;
        std::mt19937 mt(rd());

        /**
         * For each sprisification parameter and seed count and algo_name,
         * run an instance
         */
        for (auto sparsification_prob : cfp.sparsification_prob) {
            for (auto seed_count: cfp.seed_count) {

                params.seed_count = seed_count;
                params.seed_vertices.clear();

                /**
                 * We fix the seed vertices and run for params.no_of_repeat many iterations with the
                 * seed vertex remaining fixed.
                 * We just need to
                 * sample uniform random seed vertex from the entire graph.
                 * THIS IS THE NORMAL MODE IN WHICH ALL BASELINE AND OUR
                 * ALGORITHMS ARE EXECUTED
                 */
                VertexIdx n = cg.nVertices;
                std::uniform_int_distribution<VertexIdx> dist_seed_vertex(0, n - 1);
                for (VertexIdx sC = 0; sC < params.seed_count; sC++) {
                    VertexIdx seed = dist_seed_vertex(mt); // TODO: verify randomness
                    params.seed_vertices.emplace_back(seed);
                }

                for (auto algo_name : cfp.algo_names) {
                    /**
                     * Update parameters for this particular run
                     */
                    params.algo_name = algo_name;
                    params.sparsification_prob = sparsification_prob;
                    params.walk_length = cg.nEdges * sparsification_prob; // g.nEdges is twice the number of edges
                    params.subsample_size = params.walk_length * cfp.subsample_prob;
                    EdgeIdx triangle_count = cfp.triangle_count[i];

                    if (algo_name == "TETRIS") {                     // Our Algorithm
                        TriangleEstimator(&cg, params, triangle_count, TETRIS);
                    } else if (algo_name == "VertexMCMC") {
                        // Vertex MCMC sees about 2.5 time more of the edges for same walk length. For comparsion, we adjust the walk length accordingly.
                        params.walk_length = floor(params.walk_length *22 / 80);
                        TriangleEstimator(&cg, params, triangle_count, VertexMCMC);
                    }
                    else if (algo_name == "SRW1") {
                        params.walk_length = floor(params.walk_length * 22 / 40);
                        params.CSS = cfp.CSS;
                        params.NB = cfp.NB;
                        TriangleEstimator(&cg, params, triangle_count, SRW1);
                    }
                    else if (algo_name == "SERWC") { // Baseline:  do a random walk and count the number of triangles incident on each edge. Then scale.
                        params.walk_length = floor(params.walk_length * 2 / 3);
                        TriangleEstimator(&cg, params, triangle_count, SERWC);
                    }
                    else if (algo_name == "SEC") { // Baseline:  do a random walk and count the number of triangles incident on each edge. Then scale.
                        params.walk_length = floor(params.walk_length *2/3);
                        TriangleEstimator(&cg, params, triangle_count, SEC);
                    }
                    else if (algo_name == "UESS") { // Baseline:  do a random walk and count the number of triangles incident on each edge. Then scale.
                        params.walk_length = floor(params.walk_length);
                        TriangleEstimator(&cg, params, triangle_count, UESS);
                    }
                    else
                        std::cout << "Unknown algorithm option. \n";
//                            // Baseline: sample an edge and count the number of triangles incident on it. Then scale.
//                        else if (algo_name == "EstTriByEdgeSampleAndCount")
//                            TriangleEstimator(&cg, params, triangle_count, EstTriByEdgeSampleAndCount);
//                            // Baseline: do a random walk and count the teiangles in induces multi-graph. Scale.
//                        else if (algo_name == "EstTriByRW")
//                            TriangleEstimator(&cg, params, triangle_count, EstTriByRW);
//                            // Sample an edge, sample a neighbor and estimate the teiangles incident on the neighbor. Scale up.
//                        else if (algo_name == "EstTriByRWandNborSampling")
//                            TriangleEstimator(&cg, params, triangle_count, EstTriByRWandNborSampling);
//                            // Sample each edge with probability p and count traingles in the subsampled graph. Scale by 1/p^3.
//                        else if (algo_name == "EstTriBySparsification")
//                            TriangleEstimator(&cg, params, triangle_count, EstTriBySparsification);
//                            // Uniformly Sample edges, and count the number of triangles in the multi-graph.
//                        else if (algo_name == "UESS")
//                            TriangleEstimator(&cg, params, triangle_count, UESS);
                }
            }

        }
    }
    return 0;
}